

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O1

void event_track::write_vtt_track_cmaf_header(uint32_t track_id,uint32_t timescale,ostream *ot)

{
  size_t sVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sparse_moov;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar1 = strlen(webvtt::base_64_moov);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,webvtt::base_64_moov,webvtt::base_64_moov + sVar1);
  base64_decode(&local_60,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  fmp4_stream::set_track_id(&local_60,track_id);
  uVar2 = timescale >> 0x18 | (timescale & 0xff0000) >> 8 | (timescale & 0xff00) << 8 |
          timescale << 0x18;
  *(uint *)(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x1c) = uVar2;
  *(uint *)(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0xf4) = uVar2;
  if (*(int *)(ot + *(long *)(*(long *)ot + -0x18) + 0x20) == 0) {
    std::ostream::write((char *)ot,0x11bb00);
    std::ostream::write((char *)ot,
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void event_track::write_vtt_track_cmaf_header(uint32_t track_id, uint32_t timescale, std::ostream& ot)
{
	std::vector<uint8_t> sparse_moov = base64_decode(webvtt::base_64_moov);
	
	set_track_id(sparse_moov, track_id);
	
	// write back the timescale mvhd / mhd
	fmp4_write_uint32(timescale, (char*)&sparse_moov[28]);
	fmp4_write_uint32(timescale, (char*)&sparse_moov[244]);

	if (ot.good())
	{
		// write the ftyp header  
		ot.write((char*)&sparse_ftyp_vtt[0], 20);
		ot.write((const char*)&sparse_moov[0], sparse_moov.size());
	}

	return;
}